

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

string * get_model_endpoint_abi_cxx11_(void)

{
  char *pcVar1;
  char *pcVar2;
  string *in_RDI;
  allocator<char> local_19;
  
  pcVar1 = getenv("MODEL_ENDPOINT");
  pcVar2 = getenv("HF_ENDPOINT");
  if (pcVar1 != (char *)0x0) {
    pcVar2 = pcVar1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)in_RDI,"https://huggingface.co/",&local_19);
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::assign((char *)in_RDI);
    if ((in_RDI->_M_dataplus)._M_p[in_RDI->_M_string_length - 1] != '/') {
      std::__cxx11::string::push_back((char)in_RDI);
    }
  }
  return in_RDI;
}

Assistant:

std::string get_model_endpoint() {
    const char * model_endpoint_env = getenv("MODEL_ENDPOINT");
    // We still respect the use of environment-variable "HF_ENDPOINT" for backward-compatibility.
    const char * hf_endpoint_env = getenv("HF_ENDPOINT");
    const char * endpoint_env = model_endpoint_env ? model_endpoint_env : hf_endpoint_env;
    std::string model_endpoint = "https://huggingface.co/";
    if (endpoint_env) {
        model_endpoint = endpoint_env;
        if (model_endpoint.back() != '/') model_endpoint += '/';
    }
    return model_endpoint;
}